

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_stroke.cpp
# Opt level: O0

void __thiscall agg::vcgen_stroke::vcgen_stroke(vcgen_stroke *this)

{
  vcgen_stroke *this_local;
  
  math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::math_stroke(&this->m_stroker);
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks = (vertex_dist **)0x0;
  *(undefined8 *)&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_block_ptr_inc = 0
  ;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_num_blocks = 0;
  *(undefined8 *)&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_max_blocks = 0;
  vertex_sequence<agg::vertex_dist,_6U>::vertex_sequence(&this->m_src_vertices);
  pod_bvector<agg::point_base<double>,_6U>::pod_bvector(&this->m_out_vertices);
  this->m_shorten = 0.0;
  this->m_closed = 0;
  this->m_status = initial;
  this->m_src_vertex = 0;
  this->m_out_vertex = 0;
  return;
}

Assistant:

vcgen_stroke::vcgen_stroke() :
        m_stroker(),
        m_src_vertices(),
        m_out_vertices(),
        m_shorten(0.0),
        m_closed(0),
        m_status(initial),
        m_src_vertex(0),
        m_out_vertex(0)
    {
    }